

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint128_t __thiscall
farmhashcc::CityHash128WithSeed(farmhashcc *this,char *s,size_t len,uint128_t seed)

{
  char *pcVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  unsigned_long extraout_RDX_02;
  unsigned_long extraout_RDX_03;
  unsigned_long extraout_RDX_04;
  long *s_00;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  util *this_00;
  ulong uVar13;
  long lVar14;
  unsigned_long uVar15;
  farmhashcc *s_01;
  util *puVar16;
  pair<unsigned_long,_unsigned_long> pVar17;
  pair<unsigned_long,_unsigned_long> pVar18;
  uint128_t uVar19;
  uint128_t x;
  uint128_t x_00;
  uint128_t x_01;
  uint128_t x_02;
  uint128_t x_03;
  uint128_t x_04;
  uint128_t x_05;
  uint128_t x_06;
  unsigned_long local_58;
  unsigned_long local_50;
  util *local_48;
  
  uVar8 = seed.first;
  if (s < (char *)0x80) {
    if (s < (char *)0x11) {
      lVar10 = -0x651e95c4d06fbfb1;
      this_00 = (util *)((len * -0x4b6d499041670d8d >> 0x2f ^ len * -0x4b6d499041670d8d) *
                        -0x4b6d499041670d8d);
      if (s < (char *)0x8) {
        if (s < (char *)0x4) {
          if (s != (char *)0x0) {
            len = (ulong)(byte)(this + -1)[(long)s] << 2 | (ulong)s;
            uVar11 = len * -0x3c5a37a36834ced9 ^
                     (ulong)CONCAT11(this[(ulong)s >> 1],*this) * -0x651e95c4d06fbfb1;
            lVar10 = (uVar11 >> 0x2f ^ uVar11) * -0x651e95c4d06fbfb1;
          }
        }
        else {
          lVar10 = (long)s * 2 + -0x651e95c4d06fbfb1;
          uVar11 = ((ulong)(s + (ulong)*(uint *)this * 8) ^ (ulong)*(uint *)(this + -4 + (long)s)) *
                   lVar10;
          len = *(uint *)(this + -4 + (long)s) ^ uVar11;
          uVar11 = (uVar11 >> 0x2f ^ len) * lVar10;
          lVar10 = (uVar11 >> 0x2f ^ uVar11) * lVar10;
        }
        uVar12 = lVar10 + uVar8 * -0x4b6d499041670d8d;
        uVar11 = uVar12;
      }
      else {
        len = *(size_t *)(this + -8 + (long)s);
        uVar12 = *(ulong *)this;
        lVar10 = (long)s * 2 + -0x651e95c4d06fbfb1;
        uVar11 = uVar12 + 0x9ae16a3b2f90404f;
        uVar13 = ((len >> 0x25 | len << 0x1b) * lVar10 + uVar11 ^
                 (long)(len + (uVar11 >> 0x19 | uVar11 << 0x27)) * lVar10) * lVar10;
        uVar11 = (uVar13 >> 0x2f ^ (long)(len + (uVar11 >> 0x19 | uVar11 << 0x27)) * lVar10 ^ uVar13
                 ) * lVar10;
        uVar11 = (uVar11 >> 0x2f ^ uVar11) * lVar10 + uVar8 * -0x4b6d499041670d8d;
      }
      puVar16 = (util *)((ulong)(this_00 + uVar12) >> 0x2f ^ (ulong)(this_00 + uVar12));
    }
    else {
      x_02.second = len;
      x_02.first = len;
      uVar11 = util::Hash128to64((util *)(*(long *)(this + -8 + (long)s) + -0x4b6d499041670d8d),x_02
                                );
      x_03.first = uVar11 + *(long *)(this + -0x10 + (long)s);
      x_03.second = extraout_RDX_02;
      puVar16 = (util *)util::Hash128to64((util *)(s + uVar8),x_03);
      this_00 = puVar16 + len;
      pcVar9 = s + 0x10;
      do {
        pcVar9 = pcVar9 + -0x10;
        len = (size_t)(this + 0x10);
        this_00 = (util *)((((ulong)(*(long *)this * -0x4b6d499041670d8d) >> 0x2f ^
                            *(long *)this * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^
                           (ulong)this_00) * -0x4b6d499041670d8d);
        uVar8 = uVar8 ^ (ulong)this_00;
        uVar11 = (((ulong)(*(long *)(this + 8) * -0x4b6d499041670d8d) >> 0x2f ^
                  *(long *)(this + 8) * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar11) *
                 -0x4b6d499041670d8d;
        puVar16 = (util *)((ulong)puVar16 ^ uVar11);
        this = (farmhashcc *)len;
      } while ((char *)0x20 < pcVar9);
    }
    x_04.second = len;
    x_04.first = uVar11;
    uVar4 = util::Hash128to64(this_00,x_04);
    x_05.second = extraout_RDX_03;
    x_05.first = uVar8;
    puVar16 = (util *)util::Hash128to64(puVar16,x_05);
    uVar8 = (ulong)puVar16 ^ uVar4;
    uVar7 = extraout_RDX_04;
  }
  else {
    uVar11 = (long)s * -0x4b6d499041670d8d;
    s_01 = this + 0x40;
    uVar12 = ((uVar8 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar8 ^ 0xb492b66fbe98f273) << 0xf) *
             -0x4b6d499041670d8d + *(long *)this;
    pVar17.second = (uVar12 >> 0x2a | uVar12 * 0x400000) * -0x4b6d499041670d8d + *(long *)(this + 8)
    ;
    pVar17.first = uVar12;
    pVar18.second =
         (*(long *)(this + 0x58) + len >> 0x35 | (*(long *)(this + 0x58) + len) * 0x800) *
         -0x4b6d499041670d8d;
    pVar18.first = (uVar11 + uVar8 >> 0x23 | (uVar11 + uVar8) * 0x20000000) * -0x4b6d499041670d8d +
                   len;
    pcVar9 = s;
    do {
      uVar11 = uVar11 + pVar18.first;
      uVar12 = len + pVar17.first + uVar8 + *(long *)(s_01 + -0x38);
      uVar8 = uVar8 + pVar17.second + *(long *)(s_01 + -0x10);
      lVar10 = (uVar11 >> 0x21 | uVar11 * 0x80000000) * -0x4b6d499041670d8d;
      uVar11 = (uVar12 >> 0x25 | uVar12 * 0x8000000) * -0x4b6d499041670d8d ^ pVar18.second;
      lVar14 = pVar17.first + *(long *)(s_01 + -0x18) +
               (uVar8 >> 0x2a | uVar8 * 0x400000) * -0x4b6d499041670d8d;
      pVar17 = WeakHashLen32WithSeeds
                         ((char *)(s_01 + -0x40),pVar17.second * -0x4b6d499041670d8d,
                          pVar18.first + uVar11);
      pVar18 = WeakHashLen32WithSeeds
                         ((char *)(s_01 + -0x20),pVar18.second + lVar10,
                          *(long *)(s_01 + -0x30) + lVar14);
      uVar11 = uVar11 + pVar18.first;
      uVar8 = lVar10 + lVar14 + pVar17.first + *(long *)(s_01 + 8);
      len = (uVar11 >> 0x21 | uVar11 * 0x80000000) * -0x4b6d499041670d8d;
      uVar12 = lVar14 + pVar17.second + *(long *)(s_01 + 0x30);
      uVar11 = (uVar8 >> 0x25 | uVar8 * 0x8000000) * -0x4b6d499041670d8d ^ pVar18.second;
      uVar8 = pVar17.first + *(long *)(s_01 + 0x28) +
              (uVar12 >> 0x2a | uVar12 * 0x400000) * -0x4b6d499041670d8d;
      pVar17 = WeakHashLen32WithSeeds
                         ((char *)s_01,pVar17.second * -0x4b6d499041670d8d,pVar18.first + uVar11);
      pVar18 = WeakHashLen32WithSeeds
                         ((char *)(s_01 + 0x20),pVar18.second + len,*(long *)(s_01 + 0x10) + uVar8);
      uVar13 = pVar18.second;
      uVar12 = pVar18.first;
      s_01 = s_01 + 0x80;
      pcVar9 = pcVar9 + -0x80;
    } while ((char *)0x7f < pcVar9);
    uVar6 = pVar17.first + uVar11;
    local_48 = (util *)((uVar6 >> 0x31 | uVar6 * 0x8000) * -0x3c5a37a36834ced9 + len);
    local_58 = uVar12 * 9;
    lVar10 = (uVar13 >> 0x25 | uVar13 << 0x1b) + uVar8 * -0x3c5a37a36834ced9;
    uVar7 = (uVar12 >> 0x1b | uVar12 << 0x25) + uVar11 * -0x3c5a37a36834ced9;
    s_00 = (long *)(s + -0x20 + (long)this);
    pcVar1 = (char *)0x0;
    local_50 = uVar7;
    while( true ) {
      uVar5 = pVar17.second;
      uVar15 = pVar17.first * -0x3c5a37a36834ced9;
      if (pcVar9 <= pcVar1) break;
      pcVar1 = pcVar1 + 0x20;
      local_58 = local_58 + s_00[2];
      puVar16 = local_48 + lVar10;
      local_48 = (util *)((long)local_48 * -0x3c5a37a36834ced9 + local_58);
      lVar10 = ((ulong)puVar16 >> 0x2a | (long)puVar16 * 0x400000) * -0x3c5a37a36834ced9 + uVar5;
      local_50 = local_50 + uVar13 + *s_00;
      uVar13 = uVar13 + uVar15;
      pVar17 = WeakHashLen32WithSeeds((char *)s_00,uVar15 + local_50,uVar5);
      uVar7 = pVar17.second;
      s_00 = s_00 + -4;
    }
    x.second = uVar7;
    x.first = uVar15;
    uVar2 = util::Hash128to64(local_48,x);
    x_00.second = extraout_RDX;
    x_00.first = local_58;
    uVar4 = util::Hash128to64((util *)(lVar10 + local_50),x_00);
    x_01.second = extraout_RDX_00;
    x_01.first = uVar13;
    uVar3 = util::Hash128to64((util *)(uVar2 + uVar5),x_01);
    puVar16 = (util *)(uVar2 + uVar13);
    uVar8 = uVar3 + uVar4;
    uVar4 = uVar4 + uVar5;
    uVar7 = extraout_RDX_01;
  }
  x_06.second = uVar7;
  x_06.first = uVar4;
  uVar5 = util::Hash128to64(puVar16,x_06);
  uVar19.second = uVar5;
  uVar19.first = uVar8;
  return uVar19;
}

Assistant:

uint128_t CityHash128WithSeed(const char *s, size_t len, uint128_t seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64_t, uint64_t> v, w;
  uint64_t x = Uint128Low64(seed);
  uint64_t y = Uint128High64(seed);
  uint64_t z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  y = y * k0 + Rotate(w.second, 37);
  z = z * k0 + Rotate(w.first, 27);
  w.first *= 9;
  v.first *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
    v.first *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128_t(HashLen16(x + v.second, w.second) + y,
                   HashLen16(x + w.second, y + v.second));
}